

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_witness_stack_set
              (wally_tx_witness_stack *stack,size_t index,uchar *witness,size_t witness_len)

{
  _Bool _Var1;
  void *pvVar2;
  wally_tx_witness_item *p;
  uchar *new_witness;
  size_t witness_len_local;
  uchar *witness_local;
  size_t index_local;
  wally_tx_witness_stack *stack_local;
  
  p = (wally_tx_witness_item *)0x0;
  new_witness = (uchar *)witness_len;
  witness_len_local = (size_t)witness;
  witness_local = (uchar *)index;
  index_local = (size_t)stack;
  _Var1 = is_valid_witness_stack(stack);
  if ((_Var1) && ((witness_len_local != 0 || (new_witness == (uchar *)0x0)))) {
    _Var1 = clone_bytes((uchar **)&p,(uchar *)witness_len_local,(size_t)new_witness);
    if (_Var1) {
      if (*(uchar **)(index_local + 8) <= witness_local) {
        if (*(uchar **)(index_local + 0x10) <= witness_local) {
          pvVar2 = realloc_array(*(void **)index_local,*(size_t *)(index_local + 0x10),
                                 (size_t)(witness_local + 1),0x10);
          if (pvVar2 == (void *)0x0) {
            clear_and_free(p,(size_t)new_witness);
            return -3;
          }
          clear_and_free(*(void **)index_local,*(long *)(index_local + 8) << 4);
          *(void **)index_local = pvVar2;
          *(uchar **)(index_local + 0x10) = witness_local + 1;
        }
        *(uchar **)(index_local + 8) = witness_local + 1;
      }
      clear_and_free(*(void **)(*(long *)index_local + (long)witness_local * 0x10),
                     *(size_t *)(*(long *)index_local + (long)witness_local * 0x10 + 8));
      *(wally_tx_witness_item **)(*(long *)index_local + (long)witness_local * 0x10) = p;
      *(uchar **)(*(long *)index_local + (long)witness_local * 0x10 + 8) = new_witness;
      stack_local._4_4_ = 0;
    }
    else {
      stack_local._4_4_ = -3;
    }
  }
  else {
    stack_local._4_4_ = -2;
  }
  return stack_local._4_4_;
}

Assistant:

int wally_tx_witness_stack_set(struct wally_tx_witness_stack *stack, size_t index,
                               const unsigned char *witness, size_t witness_len)
{
    unsigned char *new_witness = NULL;

    if (!is_valid_witness_stack(stack) || (!witness && witness_len))
        return WALLY_EINVAL;

    if (!clone_bytes(&new_witness, witness, witness_len))
        return WALLY_ENOMEM;

    if (index >= stack->num_items) {
        if (index >= stack->items_allocation_len) {
            /* Expand the witness array */
            struct wally_tx_witness_item *p;
            p = realloc_array(stack->items, stack->items_allocation_len,
                              index + 1, sizeof(*stack->items));
            if (!p) {
                clear_and_free(new_witness, witness_len);
                return WALLY_ENOMEM;
            }
            clear_and_free(stack->items, stack->num_items * sizeof(*stack->items));
            stack->items = p;
            stack->items_allocation_len = index + 1;
        }
        stack->num_items = index + 1;
    }
    clear_and_free(stack->items[index].witness, stack->items[index].witness_len);
    stack->items[index].witness = new_witness;
    stack->items[index].witness_len = witness_len;
    return WALLY_OK;
}